

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitStore(wasm::Store__(void *this,Store *curr)

{
  Store SVar1;
  long *plVar2;
  BasicType BVar3;
  Ref RVar4;
  Ref element;
  Ref obj;
  undefined8 *puVar5;
  long lVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  int shifts;
  Store *pSVar7;
  Ref in_R8;
  byte bVar8;
  IString nextResult;
  IString key;
  IString op;
  IString possible;
  IString possible_00;
  IString name;
  IString name_00;
  IString name_01;
  IString name_02;
  IString name_03;
  Name NVar9;
  Name NVar10;
  undefined1 local_250 [8];
  Store fakeStore;
  ostream local_240 [32];
  bool *local_220;
  _Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_> *local_218;
  _Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_> local_c8;
  _Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_> local_b0;
  undefined1 local_98 [8];
  ScopedTemp ptr;
  ScopedTemp value;
  long local_40;
  Ref local_30;
  
  bVar8 = 0;
  plVar2 = *(long **)(*(long *)((long)this + 0x20) + 0x78);
  if (((plVar2 != *(long **)(*(long *)((long)this + 0x20) + 0x80)) &&
      (lVar6 = *plVar2, *(ulong *)(lVar6 + 0x38) < *(ulong *)(lVar6 + 0x40))) &&
     (*(long *)(curr + 8) != 1)) {
    FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)local_250,*(Expression **)(curr + 0x30));
    if (local_250 == (undefined1  [8])_fakeStore) {
      FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)local_98,*(Expression **)(curr + 0x38));
      if (local_98 == (undefined1  [8])ptr.parent) {
        FindAll<wasm::CallIndirect>::FindAll
                  ((FindAll<wasm::CallIndirect> *)&ptr.needFree,*(Expression **)(curr + 0x30));
        if ((Wasm2JSBuilder *)ptr._32_8_ == value.parent) {
          FindAll<wasm::CallIndirect>::FindAll
                    ((FindAll<wasm::CallIndirect> *)&value.needFree,*(Expression **)(curr + 0x38));
          if (CONCAT71(value._33_7_,value.needFree) == local_40) {
            FindAll<wasm::MemoryGrow>::FindAll
                      ((FindAll<wasm::MemoryGrow> *)&local_b0,*(Expression **)(curr + 0x30));
            if ((pointer)CONCAT71(local_b0._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_b0._M_impl.super__Vector_impl_data._M_start._0_1_) ==
                local_b0._M_impl.super__Vector_impl_data._M_finish) {
              FindAll<wasm::MemoryGrow>::FindAll
                        ((FindAll<wasm::MemoryGrow> *)&local_c8,*(Expression **)(curr + 0x38));
              std::_Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>::
              ~_Vector_base(&local_c8);
              std::_Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>::
              ~_Vector_base(&local_b0);
              std::_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::
              ~_Vector_base((_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                             *)&value.needFree);
              std::_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::
              ~_Vector_base((_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                             *)&ptr.needFree);
              std::_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>::~_Vector_base
                        ((_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)local_98);
              std::_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>::~_Vector_base
                        ((_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)local_250);
              if (local_c8._M_impl.super__Vector_impl_data._M_start !=
                  local_c8._M_impl.super__Vector_impl_data._M_finish) goto LAB_00154188;
              goto LAB_00153ff3;
            }
            std::_Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>::
            ~_Vector_base(&local_b0);
          }
          std::_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::
          ~_Vector_base((_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_> *
                        )&value.needFree);
        }
        std::_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::
        ~_Vector_base((_Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_> *)
                      &ptr.needFree);
      }
      std::_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>::~_Vector_base
                ((_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)local_98);
    }
    std::_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>::~_Vector_base
              ((_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)local_250);
LAB_00154188:
    local_30.inst = (Value *)0x0;
    possible.str._M_str = _finalize;
    possible.str._M_len = NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              ((ScopedTemp *)local_98,(Type)0x2,*this,*(Function **)((long)this + 0x18),possible);
    RVar4 = visitAndAssign(wasm::Expression*,wasm::Wasm2JSBuilder::processExpression(wasm::
            Expression*,wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::ScopedTemp__
                      (this,*(Expression **)(curr + 0x30),(ScopedTemp *)local_98);
    sequenceAppend(&local_30,RVar4);
    possible_00.str._M_str = _finalize;
    possible_00.str._M_len = NO_RESULT;
    ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
              (&ptr.needFree,(Type)*(uintptr_t *)(*(long *)(curr + 0x38) + 8),*this,
               *(Function **)((long)this + 0x18),possible_00);
    RVar4 = visitAndAssign(wasm::Expression*,wasm::Wasm2JSBuilder::processExpression(wasm::
            Expression*,wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::ScopedTemp__
                      (this,*(Expression **)(curr + 0x38),(ScopedTemp *)&ptr.needFree);
    sequenceAppend(&local_30,RVar4);
    value.needFree = true;
    NVar9.super_IString.str._M_str = (char *)ptr.type.id;
    NVar9.super_IString.str._M_len = *(size_t *)((long)this + 0x18);
    ::wasm::Function::getLocalIndex(NVar9);
    local_b0._M_impl.super__Vector_impl_data._M_start._0_1_ = 8;
    NVar10.super_IString.str._M_str = (char *)value.type.id;
    NVar10.super_IString.str._M_len = *(size_t *)((long)this + 0x18);
    local_b0._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         ::wasm::Function::getLocalIndex(NVar10);
    local_218 = &local_b0;
    local_b0._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(*(long *)(curr + 0x38) + 8);
    pSVar7 = (Store *)local_250;
    for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pSVar7 = *(undefined8 *)curr;
      curr = curr + (ulong)bVar8 * -0x10 + 8;
      pSVar7 = pSVar7 + (ulong)bVar8 * -0x10 + 8;
    }
    local_220 = &value.needFree;
    RVar4 = Store__(this,(Store *)local_250);
    sequenceAppend(&local_30,RVar4);
    processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)&ptr.needFree);
    processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_98);
    return (Ref)local_30.inst;
  }
LAB_00153ff3:
  if ((*(ulong *)(curr + 0x20) != 0) && (*(ulong *)(curr + 0x20) != (ulong)(byte)curr[0x10])) {
    __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                  ,0x5f8,
                  "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitStore(Store *)"
                 );
  }
  RVar4 = makePointer(wasm::Expression*,wasm::Address_
                    (this,*(Expression **)(curr + 0x30),(Address)*(address64_t *)(curr + 0x18));
  nextResult.str._M_str = cashew::RSHIFT;
  nextResult.str._M_len = EXPRESSION_RESULT;
  element = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x38),nextResult);
  BVar3 = Type::getBasic((Type *)(curr + 0x40));
  if (BVar3 == f64) {
    name_00.str._M_str = extraout_RDX;
    name_00.str._M_len = _vtable;
    obj = cashew::ValueBuilder::makeName(cashew::HEAPF64,name_00);
    shifts = 3;
  }
  else {
    if (BVar3 == f32) {
      puVar5 = &cashew::HEAPF32;
    }
    else {
      if (BVar3 != i32) {
        Fatal::Fatal((Fatal *)local_250);
        std::operator<<(local_240,"Unhandled type in store: ");
        Fatal::operator<<((Fatal *)local_250,(Type *)(curr + 0x40));
        Fatal::~Fatal((Fatal *)local_250);
      }
      SVar1 = curr[0x10];
      if (SVar1 != (Store)0x4) {
        if (SVar1 == (Store)0x2) {
          name_01.str._M_str = extraout_RDX;
          name_01.str._M_len = cashew::PLUS;
          obj = cashew::ValueBuilder::makeName(cashew::HEAP16,name_01);
          shifts = 1;
        }
        else {
          if (SVar1 != (Store)0x1) {
            abort();
          }
          name.str._M_str = extraout_RDX;
          name.str._M_len = (size_t)cashew::HEAPF64;
          obj = cashew::ValueBuilder::makeName(cashew::HEAP8,name);
          shifts = 0;
        }
        goto LAB_001542e6;
      }
      puVar5 = &cashew::HEAP32;
    }
    name_02.str._M_str = extraout_RDX;
    name_02.str._M_len = puVar5[1];
    obj = cashew::ValueBuilder::makeName((ValueBuilder *)*puVar5,name_02);
    shifts = 2;
  }
LAB_001542e6:
  RVar4 = cashew::ValueBuilder::makePtrShift(RVar4,shifts);
  local_250 = (undefined1  [8])cashew::ValueBuilder::makeSub(obj,RVar4);
  if (curr[0x28] == (Store)0x1) {
    name_03.str._M_str = extraout_RDX_00;
    name_03.str._M_len = _makeJsCoercedZero;
    RVar4 = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_03);
    key.str._M_str = (char *)&cashew::STORE;
    key.str._M_len = _add;
    RVar4 = cashew::ValueBuilder::makeDot(RVar4.inst,cashew::STORE,key);
    RVar4 = cashew::ValueBuilder::makeCall(RVar4);
    puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)local_250);
    cashew::ValueBuilder::appendToCall(RVar4,(Value *)*puVar5);
    puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)local_250);
    cashew::ValueBuilder::appendToCall(RVar4,(Value *)*puVar5);
    cashew::ValueBuilder::appendToCall(RVar4,element);
    return (Ref)RVar4.inst;
  }
  op.str._M_str = (char *)element.inst;
  op.str._M_len = BLOCK;
  RVar4 = cashew::ValueBuilder::makeBinary((ValueBuilder *)local_250,cashew::SET,op,in_R8);
  return (Ref)RVar4.inst;
}

Assistant:

Ref visitStore(Store* curr) {
      if (!module->memories.empty() &&
          module->memories[0]->initial < module->memories[0]->max &&
          curr->type != Type::unreachable) {
        // In JS, if memory grows then it is dangerous to write
        //  HEAP[f()] = ..
        // or
        //  HEAP[..] = f()
        // since if the call swaps HEAP (in a growth operation) then
        // we will not actually write to the new version (since the
        // semantics of JS mean we already looked at HEAP and have
        // decided where to assign to).
        if (!FindAll<Call>(curr->ptr).list.empty() ||
            !FindAll<Call>(curr->value).list.empty() ||
            !FindAll<CallIndirect>(curr->ptr).list.empty() ||
            !FindAll<CallIndirect>(curr->value).list.empty() ||
            !FindAll<MemoryGrow>(curr->ptr).list.empty() ||
            !FindAll<MemoryGrow>(curr->value).list.empty()) {
          Ref ret;
          ScopedTemp ptr(Type::i32, parent, func);
          sequenceAppend(ret, visitAndAssign(curr->ptr, ptr));
          ScopedTemp value(curr->value->type, parent, func);
          sequenceAppend(ret, visitAndAssign(curr->value, value));
          LocalGet getPtr;
          getPtr.index = func->getLocalIndex(ptr.getName());
          getPtr.type = Type::i32;
          LocalGet getValue;
          getValue.index = func->getLocalIndex(value.getName());
          getValue.type = curr->value->type;
          Store fakeStore = *curr;
          fakeStore.ptr = &getPtr;
          fakeStore.value = &getValue;
          sequenceAppend(ret, visitStore(&fakeStore));
          return ret;
        }
      }
      // FIXME if memory growth, store ptr cannot contain a function call
      //       also other stores to memory, check them, all makeSub's
      // Unaligned loads and stores must have been fixed up already.
      assert(curr->align == 0 || curr->align == curr->bytes);
      // normal store
      Ref ptr = makePointer(curr->ptr, curr->offset);
      Ref value = visit(curr->value, EXPRESSION_RESULT);
      Ref ret;
      switch (curr->valueType.getBasic()) {
        case Type::i32: {
          switch (curr->bytes) {
            case 1:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP8),
                                          ValueBuilder::makePtrShift(ptr, 0));
              break;
            case 2:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP16),
                                          ValueBuilder::makePtrShift(ptr, 1));
              break;
            case 4:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP32),
                                          ValueBuilder::makePtrShift(ptr, 2));
              break;
            default:
              abort();
          }
          break;
        }
        case Type::f32:
          ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAPF32),
                                      ValueBuilder::makePtrShift(ptr, 2));
          break;
        case Type::f64:
          ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAPF64),
                                      ValueBuilder::makePtrShift(ptr, 3));
          break;
        default: {
          Fatal() << "Unhandled type in store: " << curr->valueType;
        }
      }
      if (curr->isAtomic) {
        Ref call = ValueBuilder::makeCall(
          ValueBuilder::makeDot(ValueBuilder::makeName(ATOMICS), STORE));
        ValueBuilder::appendToCall(call, ret[1]);
        ValueBuilder::appendToCall(call, ret[2]);
        ValueBuilder::appendToCall(call, value);
        return call;
      }
      return ValueBuilder::makeBinary(ret, SET, value);
    }